

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O0

uint32_t * pack7_16(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  uint32_t base_local;
  
  *out = *in - base;
  *out = (in[1] - base) * 0x80 | *out;
  *out = (in[2] - base) * 0x4000 | *out;
  *out = (in[3] - base) * 0x200000 | *out;
  *out = (in[4] - base) * 0x10000000 | *out;
  puVar1 = out + 1;
  *puVar1 = in[4] - base >> 4;
  *puVar1 = (in[5] - base) * 8 | *puVar1;
  *puVar1 = (in[6] - base) * 0x400 | *puVar1;
  *puVar1 = (in[7] - base) * 0x20000 | *puVar1;
  *puVar1 = (in[8] - base) * 0x1000000 | *puVar1;
  *puVar1 = (in[9] - base) * -0x80000000 | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[9] - base >> 1;
  *puVar1 = (in[10] - base) * 0x40 | *puVar1;
  *puVar1 = (in[0xb] - base) * 0x2000 | *puVar1;
  *puVar1 = (in[0xc] - base) * 0x100000 | *puVar1;
  *puVar1 = (in[0xd] - base) * 0x8000000 | *puVar1;
  puVar1 = out + 3;
  *puVar1 = in[0xd] - base >> 5;
  *puVar1 = (in[0xe] - base) * 4 | *puVar1;
  *puVar1 = (in[0xf] - base) * 0x200 | *puVar1;
  return out + 4;
}

Assistant:

uint32_t * pack7_16( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  7 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  14 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  21 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  28 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 7  -  3 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  3 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  10 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  17 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  24 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  31 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 7  -  6 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  6 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  13 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  20 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  27 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 7  -  2 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  2 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  9 ;
    ++in;

    return out + 1;
}